

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

void Omega_h::add_into<int>(Read<int> *a_data,LOs *a2b,Write<int> *b_data,Int width)

{
  Alloc *pAVar1;
  ulong uVar2;
  int n;
  ulong uVar3;
  type f;
  
  pAVar1 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = pAVar1->size;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
  }
  pAVar1 = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  n = (int)(uVar3 >> 2);
  if (n * width == (int)(uVar2 >> 2)) {
    Write<int>::Write((Write<int> *)&f,&a2b->write_);
    f.width = width;
    Write<int>::Write((Write<int> *)&f.b_data,b_data);
    Write<int>::Write((Write<int> *)&f.a_data,&a_data->write_);
    parallel_for<Omega_h::add_into<int>(Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Write<int>,int)::_lambda(int)_1_>
              (n,&f,"add_into");
    add_into<int>(Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Write<int>,int)::{lambda(int)#1}::
    ~Write((_lambda_int__1_ *)&f);
    return;
  }
  fail("assertion %s failed at %s +%d\n","a_data.size() == na * width",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0xf);
}

Assistant:

void add_into(Read<T> a_data, LOs a2b, Write<T> b_data, Int width) {
  auto na = a2b.size();
  OMEGA_H_CHECK(a_data.size() == na * width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    for (Int j = 0; j < width; ++j) {
      b_data[b * width + j] += a_data[a * width + j];
    }
  };
  parallel_for(na, f, "add_into");
}